

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConverter.cpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>_>_>
* __thiscall
cali::StringConverter::rec_dict_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>_>_>
           *__return_storage_ptr__,StringConverter *this,bool *okptr)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  bool bVar3;
  string *this_00;
  char *in_RCX;
  char in_R8B;
  string val;
  string key;
  string local_1d0;
  istringstream is;
  int aiStack_190 [88];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)this,_S_in);
  cVar2 = util::read_char((istream *)&is);
  if (cVar2 == '{') {
LAB_001be465:
    util::read_word_abi_cxx11_(&key,(util *)&is,(istream *)0x234785,in_RCX);
    cVar2 = util::read_char((istream *)&is);
    if (cVar2 != ':') {
      if (okptr != (bool *)0x0) {
        *okptr = false;
      }
      std::__cxx11::string::~string((string *)&key);
      goto LAB_001be64f;
    }
    val._M_dataplus._M_p = (pointer)&val.field_2;
    val._M_string_length = 0;
    val.field_2._M_local_buf[0] = '\0';
    cVar2 = util::read_char((istream *)&is);
    if (cVar2 == '[') {
      std::__cxx11::string::assign((char *)&val);
      util::read_nested_text_abi_cxx11_(&local_1d0,(util *)&is,(istream *)0x5b,']',in_R8B);
      std::__cxx11::string::append((string *)&val);
      std::__cxx11::string::~string((string *)&local_1d0);
      cVar2 = util::read_char((istream *)&is);
      if (cVar2 != ']') goto LAB_001be620;
LAB_001be54f:
      std::__cxx11::string::append((char *)&val);
LAB_001be586:
      if (key._M_string_length != 0) {
        std::__cxx11::string::string((string *)&local_1d0,(string *)&val);
        this_00 = (string *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>_>_>
                  ::operator[](__return_storage_ptr__,&key);
        std::__cxx11::string::operator=(this_00,(string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
      }
      cVar2 = util::read_char((istream *)&is);
      std::__cxx11::string::~string((string *)&val);
      std::__cxx11::string::~string((string *)&key);
      bVar3 = true;
      if ((cVar2 != ',') ||
         (in_RCX = *(char **)(_is + -0x18), *(int *)((long)aiStack_190 + (long)in_RCX) != 0))
      goto LAB_001be636;
      goto LAB_001be465;
    }
    if (cVar2 != '{') {
      std::istream::unget();
      util::read_word_abi_cxx11_(&local_1d0,(util *)&is,(istream *)",}",in_RCX);
      std::__cxx11::string::operator=((string *)&val,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      goto LAB_001be586;
    }
    std::__cxx11::string::assign((char *)&val);
    util::read_nested_text_abi_cxx11_(&local_1d0,(util *)&is,(istream *)0x7b,'}',in_R8B);
    std::__cxx11::string::append((string *)&val);
    std::__cxx11::string::~string((string *)&local_1d0);
    cVar2 = util::read_char((istream *)&is);
    if (cVar2 == '}') goto LAB_001be54f;
LAB_001be620:
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&key);
    bVar3 = false;
LAB_001be636:
    if (okptr == (bool *)0x0) goto LAB_001be64f;
    if (cVar2 != '}') {
      bVar3 = false;
    }
  }
  else {
    std::istream::unget();
    if (okptr == (bool *)0x0) goto LAB_001be64f;
    bVar3 = false;
  }
  *okptr = bVar3;
LAB_001be64f:
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, cali::StringConverter> cali::StringConverter::rec_dict(bool* okptr) const
{
    std::map<std::string, StringConverter> ret;
    bool                                   error = false;

    std::istringstream is(m_str);

    int  d = 0;
    char c = util::read_char(is);

    if (c == '{')
        ++d;
    else {
        is.unget();
        if (okptr)
            *okptr = false;
        return ret;
    }

    do {
        std::string key = util::read_word(is, ":");
        c               = util::read_char(is);

        if (c != ':') {
            if (okptr)
                *okptr = false;
            return ret;
        }

        std::string val;
        c = util::read_char(is);

        if (c == '{') {
            val = "{";
            val.append(util::read_nested_text(is, '{', '}'));

            c = util::read_char(is);
            if (c != '}') {
                error = true;
                break;
            }
            val.append("}");
        } else if (c == '[') {
            val = "[";
            val.append(util::read_nested_text(is, '[', ']'));

            c = util::read_char(is);
            if (c != ']') {
                error = true;
                break;
            }
            val.append("]");
        } else {
            is.unget();
            val = util::read_word(is, ",}");
        }

        if (!key.empty())
            ret[key] = StringConverter(val);

        c = util::read_char(is);
    } while (is.good() && c == ',');

    if (d > 0) {
        if (c != '}')
            error = true;
    } else
        is.unget();

    if (okptr)
        *okptr = !error;

    return ret;
}